

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:969:7),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:969:7),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *in_00;
  Void local_609;
  ExceptionOr<kj::_::Void> local_608;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *local_4a0;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *depValue;
  ExceptionOr<kj::_::Void> local_340;
  Exception *local_1d8;
  Exception *depException;
  undefined1 local_1c0 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:969:7),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)output;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::ExceptionOr
            ((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
              *)local_1c0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c0);
  local_1d8 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c0);
  if (local_1d8 == (Exception *)0x0) {
    local_4a0 = readMaybe<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>
                          ((Maybe<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
                            *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150
                              ));
    if (local_4a0 != (Response<capnproto_test::capnp::test::TestInterface::FooResults> *)0x0) {
      in_00 = mv<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>(local_4a0)
      ;
      MaybeVoidCaller<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,kj::_::Void>
      ::
      apply<capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::__0>
                (&this->func,in_00);
      handle(&local_608,this,&local_609);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_608);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_608);
    }
  }
  else {
    in = mv<kj::Exception>(local_1d8);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x30,in)
    ;
    handle(&local_340,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_340);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_340);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::
  ~ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
                *)local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }